

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_or.h
# Opt level: O2

void __thiscall
draco::StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>::
~StatusOr(StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
          *this)

{
  std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>::~unique_ptr
            (&this->value_);
  std::__cxx11::string::~string((string *)&(this->status_).error_msg_);
  return;
}

Assistant:

StatusOr() {}